

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::ParseDataObjectAnimationSet(XFileParser *this)

{
  pointer *pppAVar1;
  Scene *pSVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  Logger *this_00;
  Animation *anim;
  string animName;
  string objectName;
  Animation *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_90);
  local_98 = (Animation *)operator_new(0x38);
  (local_98->mName)._M_dataplus._M_p = (pointer)&(local_98->mName).field_2;
  (local_98->mName)._M_string_length = 0;
  (local_98->mName).field_2._M_local_buf[0] = '\0';
  (local_98->mAnims).
  super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->mAnims).
  super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->mAnims).
  super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = this->mScene;
  __position._M_current =
       (pSVar2->mAnims).
       super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pSVar2->mAnims).
      super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::XFile::Animation*,std::allocator<Assimp::XFile::Animation*>>::
    _M_realloc_insert<Assimp::XFile::Animation*const&>
              ((vector<Assimp::XFile::Animation*,std::allocator<Assimp::XFile::Animation*>> *)
               &pSVar2->mAnims,__position,&local_98);
  }
  else {
    *__position._M_current = local_98;
    pppAVar1 = &(pSVar2->mAnims).
                super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  std::__cxx11::string::_M_assign((string *)local_98);
  do {
    GetNextToken_abi_cxx11_(&local_70,this);
    if (local_70._M_string_length == 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unexpected end of file while parsing animation set.","");
      ThrowException(this,&local_50);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar4 == 0) {
        ParseDataObjectAnimation(this,local_98);
      }
      else {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"Unknown data object in animation set in x file");
        ParseUnknownDataObject(this);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  } while (iVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectAnimationSet()
{
    std::string animName;
    readHeadOfDataObject( &animName);

    Animation* anim = new Animation;
    mScene->mAnims.push_back( anim);
    anim->mName = animName;

    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.length() == 0)
            ThrowException( "Unexpected end of file while parsing animation set.");
        else
        if( objectName == "}")
            break; // animation set finished
        else
        if( objectName == "Animation")
            ParseDataObjectAnimation( anim);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in animation set in x file");
            ParseUnknownDataObject();
        }
    }
}